

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Oscilloscope.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Oscilloscope::AddLastPoint(ChFunction_Oscilloscope *this,double mx,double my)

{
  int iVar1;
  double my_local;
  
  my_local = my;
  if (mx < this->end_x) {
    Reset(this);
  }
  this->end_x = mx;
  std::__cxx11::list<double,_std::allocator<double>_>::push_back(&this->values,&my_local);
  if (this->amount < this->max_amount) {
    iVar1 = this->amount + 1;
    this->amount = iVar1;
  }
  else {
    std::__cxx11::list<double,_std::allocator<double>_>::pop_front(&this->values);
    iVar1 = this->amount;
  }
  if ((this->values).super__List_base<double,_std::allocator<double>_>._M_impl._M_node._M_size ==
      (long)iVar1) {
    return;
  }
  __assert_fail("this->values.size() == this->amount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/motion_functions/ChFunction_Oscilloscope.cpp"
                ,0x2f,"void chrono::ChFunction_Oscilloscope::AddLastPoint(double, double)");
}

Assistant:

void ChFunction_Oscilloscope::AddLastPoint(double mx, double my) {
    if (mx < end_x)
        this->Reset();
    this->end_x = mx;
    this->values.push_back(my);
    if (this->amount < this->max_amount)
        this->amount++;
    else
        this->values.pop_front();

    assert(this->values.size() == this->amount);
}